

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O2

void __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::erase_advance
          (KDTree<phosg::Vector2<long>,_long> *this,Iterator *it)

{
  Node *pNVar1;
  long lVar2;
  anon_union_8_2_94730038_for_Vector2<long>_3 aVar3;
  bool bVar4;
  _Elt_pointer ppNVar5;
  
  bVar4 = delete_node(this,*(it->pending).
                            super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur);
  if (bVar4) {
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::pop_front(&it->pending);
    ppNVar5 = (it->pending).
              super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((it->pending).
        super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppNVar5) {
      return;
    }
  }
  else {
    ppNVar5 = (it->pending).
              super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
  }
  pNVar1 = *ppNVar5;
  lVar2 = pNVar1->value;
  aVar3 = (pNVar1->pt).field_1;
  (it->current).first.field_0 = (pNVar1->pt).field_0;
  (it->current).first.field_1 = aVar3;
  (it->current).second = lVar2;
  return;
}

Assistant:

void KDTree<CoordType, ValueType>::erase_advance(Iterator& it) {
  // delete_node doesn't actually delete the node unless it was a leaf node. if
  // it wasn't a leaf, its value got replaced with a node we haven't seen yet,
  // so just leave the queue alone. if it was a leaf, then it got deleted, so
  // remove the pointer from the queue and update current
  Node* to_delete = it.pending.front();
  bool deleted = this->delete_node(to_delete);
  if (deleted) {
    it.pending.pop_front();
    if (!it.pending.empty()) {
      Node* n = it.pending.front();
      it.current = std::make_pair(n->pt, n->value);
    }
  } else {
    Node* n = it.pending.front();
    it.current = std::make_pair(n->pt, n->value);
  }
}